

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O3

void start_pass_dpost(j_decompress_ptr cinfo,J_BUF_MODE pass_mode)

{
  jpeg_d_post_controller *pjVar1;
  jpeg_error_mgr *pjVar2;
  JSAMPARRAY ppJVar3;
  code *pcVar4;
  
  pjVar1 = cinfo->post;
  if (pass_mode == JBUF_SAVE_AND_PASS) {
    if (pjVar1[1].start_pass == (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 3;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pcVar4 = post_process_prepass;
  }
  else if (pass_mode == JBUF_CRANK_DEST) {
    if (pjVar1[1].start_pass == (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 3;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pcVar4 = post_process_2pass;
  }
  else {
    if (pass_mode != JBUF_PASS_THRU) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 3;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
      goto LAB_0027885e;
    }
    if (cinfo->quantize_colors != 0) {
      pjVar1->post_process_data = post_process_1pass;
      if (pjVar1[1].post_process_data ==
          (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
           *)0x0) {
        ppJVar3 = (*cinfo->mem->access_virt_sarray)
                            ((j_common_ptr)cinfo,(jvirt_sarray_ptr)pjVar1[1].start_pass,0,
                             *(JDIMENSION *)&pjVar1[2].start_pass,1);
        pjVar1[1].post_process_data =
             (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
              *)ppJVar3;
      }
      goto LAB_0027885e;
    }
    pcVar4 = cinfo->upsample->upsample;
  }
  pjVar1->post_process_data = pcVar4;
LAB_0027885e:
  *(undefined8 *)((long)&pjVar1[2].start_pass + 4) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass_dpost (j_decompress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_post_ptr post = (my_post_ptr) cinfo->post;

  switch (pass_mode) {
  case JBUF_PASS_THRU:
    if (cinfo->quantize_colors) {
      /* Single-pass processing with color quantization. */
      post->pub.post_process_data = post_process_1pass;
      /* We could be doing buffered-image output before starting a 2-pass
       * color quantization; in that case, jinit_d_post_controller did not
       * allocate a strip buffer.  Use the virtual-array buffer as workspace.
       */
      if (post->buffer == NULL) {
	post->buffer = (*cinfo->mem->access_virt_sarray)
	  ((j_common_ptr) cinfo, post->whole_image,
	   (JDIMENSION) 0, post->strip_height, TRUE);
      }
    } else {
      /* For single-pass processing without color quantization,
       * I have no work to do; just call the upsampler directly.
       */
      post->pub.post_process_data = cinfo->upsample->upsample;
    }
    break;
#ifdef QUANT_2PASS_SUPPORTED
  case JBUF_SAVE_AND_PASS:
    /* First pass of 2-pass quantization */
    if (post->whole_image == NULL)
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    post->pub.post_process_data = post_process_prepass;
    break;
  case JBUF_CRANK_DEST:
    /* Second pass of 2-pass quantization */
    if (post->whole_image == NULL)
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    post->pub.post_process_data = post_process_2pass;
    break;
#endif /* QUANT_2PASS_SUPPORTED */
  default:
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    break;
  }
  post->starting_row = post->next_row = 0;
}